

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O0

bool __thiscall wasm::DAE::iteration(DAE *this,Module *module,DAEFunctionInfoMap *infoMap)

{
  __node_base_ptr *pp_Var1;
  type ppEVar2;
  initializer_list<wasm::Function_*> __l;
  initializer_list<wasm::Function_*> __l_00;
  Function *pFVar3;
  mapped_type *this_00;
  DAEFunctionInfo *this_01;
  bool bVar4;
  bool bVar5;
  PassRunner *pPVar6;
  reference __in;
  type *ptVar7;
  type *ptVar8;
  vector<wasm::Call*,std::allocator<wasm::Call*>> *this_02;
  reference __in_00;
  type *__k;
  type *pppEVar9;
  mapped_type *pppEVar10;
  reference pNVar11;
  reference this_03;
  pointer pEVar12;
  Name *__x;
  Function *func_00;
  reference puVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_04;
  type *ptVar14;
  pointer pFVar15;
  size_type sVar16;
  mapped_type *pmVar17;
  pointer ppVar18;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *this_05;
  iterator iVar19;
  iterator iVar20;
  reference ppCVar21;
  mapped_type *pmVar22;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar23;
  pair<std::__detail::_Node_iterator<wasm::Function_*,_true,_false>,_bool> pVar24;
  byte local_ae9;
  anon_class_8_1_dcf28b6c local_900;
  function<void_(wasm::Function_*)> local_8f8;
  size_t local_8d8;
  char *pcStack_8d0;
  _Node_iterator_base<wasm::Function_*,_false> local_8c8;
  undefined1 local_8c0;
  pointer local_8b8;
  _Node_iterator_base<wasm::Function_*,_false> local_8b0;
  undefined1 local_8a8;
  Call *local_8a0;
  size_t local_898;
  char *pcStack_890;
  Function *local_888;
  Call *local_880;
  Call *call_2;
  iterator __end5;
  iterator __begin5;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range5;
  bool allDropped;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls_3;
  _Self local_830;
  iterator iter;
  Name name_4;
  Type local_810;
  reference local_808;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_3;
  iterator __end3_5;
  iterator __begin3_5;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range3_5;
  type *outcome;
  type *removedIndexes;
  pointer ppCStack_7a0;
  pointer local_798;
  SortedVector local_790;
  allocator<wasm::Function_*> local_771;
  Function *local_770;
  iterator local_768;
  size_type local_760;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> local_758;
  pair<wasm::SortedVector,_wasm::ParamUtils::RemovalOutcome> local_740;
  size_t local_720;
  size_t numParams;
  pointer ppCStack_710;
  Function *local_708;
  Function *func_2;
  type *calls_2;
  type *name_3;
  _Self local_6e8;
  iterator __end2_3;
  iterator __begin2_3;
  map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  *__range2_3;
  size_t local_568;
  char *pcStack_560;
  Index local_554;
  iterator iStack_550;
  uint i;
  iterator __end3_4;
  iterator __begin3_4;
  SortedVector *__range3_4;
  pointer ppCStack_530;
  pointer local_528;
  allocator<wasm::Function_*> local_511;
  Function *local_510;
  iterator local_508;
  size_type local_500;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> local_4f8;
  undefined1 local_4e0 [8];
  SortedVector optimizedIndexes;
  Function *local_488;
  Function *func_1;
  type *calls_1;
  type *name_2;
  _Self local_468;
  iterator __end2_2;
  iterator __begin2_2;
  map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  *__range2_2;
  anon_class_16_2_702f4654 markCallersStale;
  anon_class_8_1_f74e94ae markStale;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  callTargetsToLocalize;
  undefined1 local_3f8 [7];
  bool refinedReturnTypes;
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  worthOptimizing;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2_1;
  Name *name_1;
  iterator __end3_3;
  iterator __begin3_3;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *__range3_3;
  type *dropp;
  type *call_1;
  _Node_iterator_base<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false> local_348;
  iterator __end3_2;
  iterator __begin3_2;
  unordered_map<wasm::Call_*,_wasm::Expression_**,_std::hash<wasm::Call_*>,_std::equal_to<wasm::Call_*>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>_>
  *__range3_2;
  Name *callee;
  iterator __end3_1;
  iterator __begin3_1;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *__range3_1;
  Call *local_2f8;
  Call *call;
  iterator __end4;
  iterator __begin4;
  type *__range4;
  __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
  local_2c0;
  const_iterator local_2b8;
  vector<wasm::Call*,std::allocator<wasm::Call*>> *local_2b0;
  mapped_type *allCallsToName;
  type *calls;
  type *name;
  _Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_true>
  local_290;
  iterator __end3;
  iterator __begin3;
  unordered_map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  *__range3;
  type *info;
  type *func;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_true> local_260;
  iterator __end2;
  iterator __begin2;
  DAEFunctionInfoMap *__range2;
  unordered_map<wasm::Expression_*,_wasm::Name,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>_>
  expressionFuncs;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  hasUnseenCalls;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  tailCallees;
  map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  allCalls;
  undefined1 local_160 [8];
  DAEScanner scanner;
  DAEFunctionInfoMap *infoMap_local;
  Module *module_local;
  DAE *this_local;
  
  scanner.info = (DAEFunctionInfo *)infoMap;
  std::
  unordered_map<wasm::Call_*,_wasm::Expression_**,_std::hash<wasm::Call_*>,_std::equal_to<wasm::Call_*>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>_>
  ::clear(&this->allDroppedCalls);
  DAEScanner::DAEScanner((DAEScanner *)local_160,(DAEFunctionInfoMap *)scanner.info);
  Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::walkModuleCode
            ((Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_> *)
             ((long)&scanner.
                     super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                     .super_Pass.passArg.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             + 0x20),module);
  pPVar6 = Pass::getPassRunner(&this->super_Pass);
  WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>::run
            ((WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
              *)local_160,pPVar6,module);
  std::
  map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  ::map((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
         *)&tailCallees._M_h._M_single_bucket);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&hasUnseenCalls._M_h._M_single_bucket);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&expressionFuncs._M_h._M_single_bucket);
  std::
  unordered_map<wasm::Expression_*,_wasm::Name,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>_>
  ::unordered_map((unordered_map<wasm::Expression_*,_wasm::Name,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>_>
                   *)&__range2);
  this_01 = scanner.info;
  __end2 = std::
           unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
           ::begin((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                    *)scanner.info);
  local_260._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
       ::end((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
              *)this_01);
  while (bVar4 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_true>
                            ,&local_260), bVar4) {
    __in = std::__detail::
           _Node_iterator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_false,_true>::
           operator*(&__end2);
    ptVar7 = std::get<0ul,wasm::Name_const,wasm::DAEFunctionInfo>(__in);
    ptVar8 = std::get<1ul,wasm::Name_const,wasm::DAEFunctionInfo>(__in);
    __end3 = std::
             unordered_map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
             ::begin(&ptVar8->calls);
    local_290._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
         ::end(&ptVar8->calls);
    while (bVar4 = std::__detail::operator!=
                             (&__end3.
                               super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_true>
                              ,&local_290), bVar4) {
      name = &std::__detail::
              _Node_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_false,_true>
              ::operator*(&__end3)->first;
      calls = (type *)std::
                      get<0ul,wasm::Name_const,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>
                                ((pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                  *)name);
      allCallsToName =
           std::get<1ul,wasm::Name_const,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>
                     ((pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                       *)name);
      this_02 = (vector<wasm::Call*,std::allocator<wasm::Call*>> *)
                std::
                map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                ::operator[]((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                              *)&tailCallees._M_h._M_single_bucket,(key_type *)calls);
      local_2b0 = this_02;
      local_2c0._M_current =
           (Call **)std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end
                              ((vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)this_02);
      __gnu_cxx::
      __normal_iterator<wasm::Call*const*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>::
      __normal_iterator<wasm::Call**>
                ((__normal_iterator<wasm::Call*const*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>
                  *)&local_2b8,&local_2c0);
      iVar19 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::begin(allCallsToName);
      iVar20 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end(allCallsToName);
      std::vector<wasm::Call*,std::allocator<wasm::Call*>>::
      insert<__gnu_cxx::__normal_iterator<wasm::Call**,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>,void>
                (this_02,local_2b8,
                 (__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                  )iVar19._M_current,
                 (__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                  )iVar20._M_current);
      this_00 = allCallsToName;
      __end4 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::begin(allCallsToName);
      call = (Call *)std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end(this_00);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                         *)&call), bVar4) {
        ppCVar21 = __gnu_cxx::
                   __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                   ::operator*(&__end4);
        __range3_1 = (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                      *)*ppCVar21;
        local_2f8 = (Call *)__range3_1;
        pmVar22 = std::
                  unordered_map<wasm::Expression_*,_wasm::Name,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>_>
                  ::operator[]((unordered_map<wasm::Expression_*,_wasm::Name,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>_>
                                *)&__range2,(key_type *)&__range3_1);
        wasm::Name::operator=(pmVar22,ptVar7);
        __gnu_cxx::
        __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
        ::operator++(&__end4);
      }
      std::__detail::
      _Node_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_false,_true>
      ::operator++(&__end3);
    }
    __end3_1 = std::
               unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
               ::begin(&ptVar8->tailCallees);
    callee = (Name *)std::
                     unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     ::end(&ptVar8->tailCallees);
    while (bVar4 = std::__detail::operator!=
                             (&__end3_1.super__Node_iterator_base<wasm::Name,_true>,
                              (_Node_iterator_base<wasm::Name,_true> *)&callee), bVar4) {
      pNVar11 = std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator*(&__end3_1);
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                *)&hasUnseenCalls._M_h._M_single_bucket,pNVar11);
      std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator++(&__end3_1);
    }
    __end3_2 = std::
               unordered_map<wasm::Call_*,_wasm::Expression_**,_std::hash<wasm::Call_*>,_std::equal_to<wasm::Call_*>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>_>
               ::begin(&ptVar8->droppedCalls);
    local_348._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Call_*,_wasm::Expression_**,_std::hash<wasm::Call_*>,_std::equal_to<wasm::Call_*>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>_>
         ::end(&ptVar8->droppedCalls);
    while (bVar4 = std::__detail::operator!=
                             (&__end3_2.
                               super__Node_iterator_base<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false>
                              ,&local_348), bVar4) {
      __in_00 = std::__detail::
                _Node_iterator<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false,_false>::
                operator*(&__end3_2);
      __k = std::get<0ul,wasm::Call*const,wasm::Expression**>(__in_00);
      pppEVar9 = std::get<1ul,wasm::Call*const,wasm::Expression**>(__in_00);
      ppEVar2 = *pppEVar9;
      pppEVar10 = std::
                  unordered_map<wasm::Call_*,_wasm::Expression_**,_std::hash<wasm::Call_*>,_std::equal_to<wasm::Call_*>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>_>
                  ::operator[](&this->allDroppedCalls,__k);
      *pppEVar10 = ppEVar2;
      std::__detail::_Node_iterator<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false,_false>
      ::operator++(&__end3_2);
    }
    __end3_3 = std::
               unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
               ::begin(&ptVar8->hasUnseenCalls);
    name_1 = (Name *)std::
                     unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     ::end(&ptVar8->hasUnseenCalls);
    while (bVar4 = std::__detail::operator!=
                             (&__end3_3.super__Node_iterator_base<wasm::Name,_true>,
                              (_Node_iterator_base<wasm::Name,_true> *)&name_1), bVar4) {
      pNVar11 = std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator*(&__end3_3);
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                *)&expressionFuncs._M_h._M_single_bucket,pNVar11);
      std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator++(&__end3_3);
    }
    std::__detail::_Node_iterator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_false,_true>::
    operator++(&__end2);
  }
  __end2_1 = std::
             vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ::begin(&module->exports);
  curr = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
         std::
         vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ::end(&module->exports);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                             *)&curr), bVar4) {
    this_03 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
              ::operator*(&__end2_1);
    pEVar12 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->(this_03)
    ;
    if (pEVar12->kind == Function) {
      pEVar12 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                          (this_03);
      __x = Export::getInternalName(pEVar12);
      pVar23 = std::
               unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
               ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                         *)&expressionFuncs._M_h._M_single_bucket,__x);
      worthOptimizing._M_h._M_single_bucket =
           (__node_base_ptr)pVar23.first.super__Node_iterator_base<wasm::Name,_true>._M_cur;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end2_1);
  }
  std::
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  ::unordered_set((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                   *)local_3f8);
  bVar4 = false;
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&markStale);
  markCallersStale.expressionFuncs =
       (unordered_map<wasm::Expression_*,_wasm::Name,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>_>
        *)scanner.info;
  __range2_2 = (map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                *)&markCallersStale.expressionFuncs;
  markCallersStale.markStale = (anon_class_8_1_f74e94ae *)&__range2;
  pp_Var1 = &tailCallees._M_h._M_single_bucket;
  __end2_2 = std::
             map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
             ::begin((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                      *)pp_Var1);
  local_468._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
       ::end((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
              *)pp_Var1);
  while (bVar5 = std::operator!=(&__end2_2,&local_468), bVar5) {
    name_2 = &std::
              _Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>
              ::operator*(&__end2_2)->first;
    calls_1 = (type *)std::
                      get<0ul,wasm::Name_const,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>
                                ((pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                  *)name_2);
    func_1 = (Function *)
             std::get<1ul,wasm::Name_const,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>
                       ((pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                         *)name_2);
    sVar16 = std::
             unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
             ::count((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                      *)&expressionFuncs._M_h._M_single_bucket,(key_type *)calls_1);
    if (sVar16 == 0) {
      func_00 = Module::getFunction(module,(IString)*(IString *)
                                                     &(calls_1->
                                                                                                            
                                                  super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>
                                                  )._M_impl.super__Vector_impl_data);
      pFVar3 = func_1;
      local_488 = func_00;
      pmVar17 = std::
                unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                ::operator[]((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                              *)scanner.info,(key_type *)calls_1);
      bVar5 = refineArgumentTypes(this,func_00,
                                  (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)pFVar3,
                                  module,pmVar17);
      if (bVar5) {
        std::
        unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
        ::insert((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                  *)local_3f8,&local_488);
        iteration::anon_class_8_1_f74e94ae::operator()
                  ((anon_class_8_1_f74e94ae *)&markCallersStale.expressionFuncs,
                   (Name)(local_488->super_Importable).super_Named.name.super_IString.str);
      }
      bVar5 = refineReturnTypes(this,local_488,
                                (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)func_1,module
                               );
      if (bVar5) {
        bVar4 = true;
        optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(local_488->super_Importable).super_Named.name.super_IString.str._M_len;
        iteration::anon_class_8_1_f74e94ae::operator()
                  ((anon_class_8_1_f74e94ae *)&markCallersStale.expressionFuncs,
                   (Name)(local_488->super_Importable).super_Named.name.super_IString.str);
        iteration::anon_class_16_2_702f4654::operator()
                  ((anon_class_16_2_702f4654 *)&__range2_2,
                   (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)func_1);
      }
      local_510 = local_488;
      local_508 = &local_510;
      local_500 = 1;
      std::allocator<wasm::Function_*>::allocator(&local_511);
      __l_00._M_len = local_500;
      __l_00._M_array = local_508;
      std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                (&local_4f8,__l_00,&local_511);
      pFVar3 = func_1;
      __range3_4 = (SortedVector *)0x0;
      ppCStack_530 = (pointer)0x0;
      local_528 = (pointer)0x0;
      std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::vector
                ((vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)&__range3_4);
      ParamUtils::applyConstantValues
                ((SortedVector *)local_4e0,&local_4f8,
                 (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)pFVar3,
                 (vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)&__range3_4,module);
      std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::~vector
                ((vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)&__range3_4);
      std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~vector(&local_4f8);
      std::allocator<wasm::Function_*>::~allocator(&local_511);
      __end3_4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4e0);
      iStack_550 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4e0);
      while (bVar5 = __gnu_cxx::operator!=(&__end3_4,&stack0xfffffffffffffab0), bVar5) {
        puVar13 = __gnu_cxx::
                  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&__end3_4);
        local_554 = *puVar13;
        pmVar17 = std::
                  unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                  ::operator[]((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                                *)scanner.info,(key_type *)calls_1);
        SortedVector::insert(&pmVar17->unusedParams,local_554);
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end3_4);
      }
      bVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4e0);
      if (!bVar5) {
        local_568 = (local_488->super_Importable).super_Named.name.super_IString.str._M_len;
        pcStack_560 = (local_488->super_Importable).super_Named.name.super_IString.str._M_str;
        iteration::anon_class_8_1_f74e94ae::operator()
                  ((anon_class_8_1_f74e94ae *)&markCallersStale.expressionFuncs,
                   (Name)(local_488->super_Importable).super_Named.name.super_IString.str);
      }
      SortedVector::~SortedVector((SortedVector *)local_4e0);
    }
    std::
    _Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>
    ::operator++(&__end2_2);
  }
  if (bVar4) {
    ReFinalize::ReFinalize((ReFinalize *)&__range2_3);
    pPVar6 = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
           *)&__range2_3,pPVar6,module);
    ReFinalize::~ReFinalize((ReFinalize *)&__range2_3);
  }
  pp_Var1 = &tailCallees._M_h._M_single_bucket;
  __end2_3 = std::
             map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
             ::begin((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                      *)pp_Var1);
  local_6e8._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
       ::end((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
              *)pp_Var1);
  while (bVar5 = std::operator!=(&__end2_3,&local_6e8), bVar5) {
    name_3 = &std::
              _Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>
              ::operator*(&__end2_3)->first;
    calls_2 = (type *)std::
                      get<0ul,wasm::Name_const,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>
                                ((pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                  *)name_3);
    func_2 = (Function *)
             std::get<1ul,wasm::Name_const,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>
                       ((pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                         *)name_3);
    sVar16 = std::
             unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
             ::count((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                      *)&expressionFuncs._M_h._M_single_bucket,(key_type *)calls_2);
    if (sVar16 == 0) {
      numParams = (size_t)(calls_2->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)
                          ._M_impl.super__Vector_impl_data._M_start;
      ppCStack_710 = (calls_2->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
      local_708 = Module::getFunction(module,(IString)*(IString *)
                                                       &(calls_2->
                                                                                                                
                                                  super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>
                                                  )._M_impl.super__Vector_impl_data);
      local_720 = Function::getNumParams(local_708);
      if (local_720 != 0) {
        local_770 = local_708;
        local_768 = &local_770;
        local_760 = 1;
        std::allocator<wasm::Function_*>::allocator(&local_771);
        __l._M_len = local_760;
        __l._M_array = local_768;
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                  (&local_758,__l,&local_771);
        pmVar17 = std::
                  unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                  ::operator[]((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                                *)scanner.info,(key_type *)calls_2);
        SortedVector::SortedVector(&local_790,&pmVar17->unusedParams);
        pFVar3 = func_2;
        removedIndexes = (type *)0x0;
        ppCStack_7a0 = (pointer)0x0;
        local_798 = (pointer)0x0;
        std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::vector
                  ((vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)&removedIndexes);
        pPVar6 = Pass::getPassRunner(&this->super_Pass);
        ParamUtils::removeParameters
                  (&local_740,&local_758,&local_790,
                   (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)pFVar3,
                   (vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)&removedIndexes,
                   module,pPVar6);
        std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::~vector
                  ((vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)&removedIndexes);
        SortedVector::~SortedVector(&local_790);
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~vector(&local_758);
        std::allocator<wasm::Function_*>::~allocator(&local_771);
        this_04 = &std::get<0ul,wasm::SortedVector,wasm::ParamUtils::RemovalOutcome>(&local_740)->
                   super_vector<unsigned_int,_std::allocator<unsigned_int>_>;
        ptVar14 = std::get<1ul,wasm::SortedVector,wasm::ParamUtils::RemovalOutcome>(&local_740);
        bVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(this_04);
        if (!bVar5) {
          std::
          unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
          ::insert((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                    *)local_3f8,&local_708);
          iteration::anon_class_8_1_f74e94ae::operator()
                    ((anon_class_8_1_f74e94ae *)&markCallersStale.expressionFuncs,
                     (Name)(local_708->super_Importable).super_Named.name.super_IString.str);
          iteration::anon_class_16_2_702f4654::operator()
                    ((anon_class_16_2_702f4654 *)&__range2_2,
                     (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)func_2);
        }
        if (*ptVar14 == Failure) {
          std::
          unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
          ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&markStale,(value_type *)calls_2);
        }
        std::pair<wasm::SortedVector,_wasm::ParamUtils::RemovalOutcome>::~pair(&local_740);
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>
    ::operator++(&__end2_3);
  }
  bVar5 = std::
          unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
          ::empty((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                   *)local_3f8);
  if (bVar5) {
    __end3_5 = std::
               vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ::begin(&module->functions);
    func_3 = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
             std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::end(&module->functions);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end3_5,
                              (__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                               *)&func_3), bVar5) {
      local_808 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                  ::operator*(&__end3_5);
      pFVar15 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                          (local_808);
      local_810 = Function::getResults(pFVar15);
      name_4.super_IString.str._M_str._4_4_ = 0;
      bVar5 = wasm::Type::operator==
                        (&local_810,(BasicType *)((long)&name_4.super_IString.str._M_str + 4));
      if (!bVar5) {
        pFVar15 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                            (local_808);
        iter._M_node = (_Base_ptr)
                       (pFVar15->super_Importable).super_Named.name.super_IString.str._M_len;
        name_4.super_IString.str._M_len =
             (size_t)(pFVar15->super_Importable).super_Named.name.super_IString.str._M_str;
        sVar16 = std::
                 unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                 ::count((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                          *)&expressionFuncs._M_h._M_single_bucket,(key_type *)&iter);
        if (((sVar16 == 0) &&
            (pmVar17 = std::
                       unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                       ::operator[]((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                                     *)scanner.info,(key_type *)&iter),
            (pmVar17->hasTailCalls & 1U) == 0)) &&
           (sVar16 = std::
                     unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     ::count((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                              *)&hasUnseenCalls._M_h._M_single_bucket,(key_type *)&iter),
           sVar16 == 0)) {
          local_830._M_node =
               (_Base_ptr)
               std::
               map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
               ::find((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                       *)&tailCallees._M_h._M_single_bucket,(key_type *)&iter);
          calls_3 = (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)
                    std::
                    map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                    ::end((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                           *)&tailCallees._M_h._M_single_bucket);
          bVar5 = std::operator==(&local_830,(_Self *)&calls_3);
          if (!bVar5) {
            ppVar18 = std::
                      _Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>
                      ::operator->(&local_830);
            this_05 = &ppVar18->second;
            iVar19 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::begin(this_05);
            iVar20 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end(this_05);
            bVar5 = std::
                    all_of<__gnu_cxx::__normal_iterator<wasm::Call**,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>,wasm::DAE::iteration(wasm::Module*,std::unordered_map<wasm::Name,wasm::DAEFunctionInfo,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::DAEFunctionInfo>>>&)::_lambda(wasm::Call*)_1_>
                              ((__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                )iVar19._M_current,
                               (__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                )iVar20._M_current,(anon_class_8_1_8991fb9c)this);
            if (bVar5) {
              pFVar15 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                                  (local_808);
              bVar5 = removeReturnValue(this,pFVar15,this_05,module);
              if (bVar5) {
                __end5 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::begin(this_05);
                call_2 = (Call *)std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end
                                           (this_05);
                while (bVar5 = __gnu_cxx::operator!=
                                         (&__end5,(
                                                  __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                                  *)&call_2), bVar5) {
                  ppCVar21 = __gnu_cxx::
                             __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                             ::operator*(&__end5);
                  local_8a0 = *ppCVar21;
                  local_880 = local_8a0;
                  pmVar22 = std::
                            unordered_map<wasm::Expression_*,_wasm::Name,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>_>
                            ::operator[]((unordered_map<wasm::Expression_*,_wasm::Name,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>_>
                                          *)&__range2,(key_type *)&local_8a0);
                  local_898 = (pmVar22->super_IString).str._M_len;
                  pcStack_890 = (pmVar22->super_IString).str._M_str;
                  local_888 = Module::getFunction(module,(Name)(pmVar22->super_IString).str);
                  pVar24 = std::
                           unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                           ::insert((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                                     *)local_3f8,&local_888);
                  local_8b0._M_cur =
                       (__node_type *)
                       pVar24.first.super__Node_iterator_base<wasm::Function_*,_false>._M_cur;
                  local_8a8 = pVar24.second;
                  __gnu_cxx::
                  __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                  ::operator++(&__end5);
                }
              }
              local_8b8 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                                    (local_808);
              pVar24 = std::
                       unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                       ::insert((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                                 *)local_3f8,&local_8b8);
              local_8c8._M_cur =
                   (__node_type *)
                   pVar24.first.super__Node_iterator_base<wasm::Function_*,_false>._M_cur;
              local_8c0 = pVar24.second;
              pFVar15 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                        operator->(local_808);
              local_8d8 = (pFVar15->super_Importable).super_Named.name.super_IString.str._M_len;
              pcStack_8d0 = (pFVar15->super_Importable).super_Named.name.super_IString.str._M_str;
              iteration::anon_class_8_1_f74e94ae::operator()
                        ((anon_class_8_1_f74e94ae *)&markCallersStale.expressionFuncs,
                         (Name)(pFVar15->super_Importable).super_Named.name.super_IString.str);
              iteration::anon_class_16_2_702f4654::operator()
                        ((anon_class_16_2_702f4654 *)&__range2_2,this_05);
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
      ::operator++(&__end3_5);
    }
  }
  bVar5 = std::
          unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
          ::empty((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&markStale);
  if (!bVar5) {
    pPVar6 = Pass::getPassRunner(&this->super_Pass);
    local_900.markStale = (anon_class_8_1_f74e94ae *)&markCallersStale.expressionFuncs;
    std::function<void(wasm::Function*)>::
    function<wasm::DAE::iteration(wasm::Module*,std::unordered_map<wasm::Name,wasm::DAEFunctionInfo,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::DAEFunctionInfo>>>&)::_lambda(wasm::Function*)_1_,void>
              ((function<void(wasm::Function*)> *)&local_8f8,&local_900);
    ParamUtils::localizeCallsTo
              ((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                *)&markStale,module,pPVar6,&local_8f8);
    std::function<void_(wasm::Function_*)>::~function(&local_8f8);
  }
  if (((this->optimize & 1U) != 0) &&
     (bVar5 = std::
              unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
              ::empty((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                       *)local_3f8), !bVar5)) {
    pPVar6 = Pass::getPassRunner(&this->super_Pass);
    OptUtils::optimizeAfterInlining((FuncSet *)local_3f8,module,pPVar6);
  }
  bVar5 = std::
          unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
          ::empty((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                   *)local_3f8);
  local_ae9 = 1;
  if ((bVar5) && (local_ae9 = 1, !bVar4)) {
    bVar4 = std::
            unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
            ::empty((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&markStale);
    local_ae9 = bVar4 ^ 0xff;
  }
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&markStale);
  std::
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  ::~unordered_set((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                    *)local_3f8);
  std::
  unordered_map<wasm::Expression_*,_wasm::Name,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>_>
  ::~unordered_map((unordered_map<wasm::Expression_*,_wasm::Name,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>_>
                    *)&__range2);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&expressionFuncs._M_h._M_single_bucket);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&hasUnseenCalls._M_h._M_single_bucket);
  std::
  map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  ::~map((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
          *)&tailCallees._M_h._M_single_bucket);
  DAEScanner::~DAEScanner((DAEScanner *)local_160);
  return (bool)(local_ae9 & 1);
}

Assistant:

bool iteration(Module* module, DAEFunctionInfoMap& infoMap) {
    allDroppedCalls.clear();

#if DAE_DEBUG
    // Enable this path to mark all contents as stale at the start of each
    // iteration, which can be used to check for staleness bugs (that is, bugs
    // where something should have been marked stale, but wasn't). Note, though,
    // that staleness bugs can easily cause serious issues with validation (e.g.
    // if data is stale we may miss that there is an additional caller, that
    // prevents refining argument types etc.), so this may not be terribly
    // helpful.
    if (getenv("ALWAYS_MARK_STALE")) {
      for (auto& [_, info] : infoMap) {
        info.markStale();
      }
    }
#endif

    DAEScanner scanner(&infoMap);
    scanner.walkModuleCode(module);
    // Scan all the functions.
    scanner.run(getPassRunner(), module);
    // Combine all the info.
    struct CallContext {
      Call* call;
      Function* func;
    };
    std::map<Name, std::vector<Call*>> allCalls;
    std::unordered_set<Name> tailCallees;
    std::unordered_set<Name> hasUnseenCalls;
    // Track the function in which relevant expressions exist. When we modify
    // those expressions we will need to mark the function's info as stale.
    std::unordered_map<Expression*, Name> expressionFuncs;
    for (auto& [func, info] : infoMap) {
      for (auto& [name, calls] : info.calls) {
        auto& allCallsToName = allCalls[name];
        allCallsToName.insert(allCallsToName.end(), calls.begin(), calls.end());
        for (auto* call : calls) {
          expressionFuncs[call] = func;
        }
      }
      for (auto& callee : info.tailCallees) {
        tailCallees.insert(callee);
      }
      for (auto& [call, dropp] : info.droppedCalls) {
        allDroppedCalls[call] = dropp;
      }
      for (auto& name : info.hasUnseenCalls) {
        hasUnseenCalls.insert(name);
      }
    }
    // Exports are considered unseen calls.
    for (auto& curr : module->exports) {
      if (curr->kind == ExternalKind::Function) {
        hasUnseenCalls.insert(*curr->getInternalName());
      }
    }

    // Track which functions we changed that are worth re-optimizing at the end.
    std::unordered_set<Function*> worthOptimizing;

    // If we refine return types then we will need to do more type updating
    // at the end.
    bool refinedReturnTypes = false;

    // If we find that localizing call arguments can help (by moving their
    // effects outside, so ParamUtils::removeParameters can handle them), then
    // we do that at the end and perform another cycle. It is simpler to just do
    // another cycle than to track the locations of calls, which is tricky as
    // localization might move a call (if a call happens to be another call's
    // param). In practice it is rare to find call arguments we want to remove,
    // and even more rare to find effects get in the way, so this should not
    // cause much overhead.
    //
    // This set tracks the functions for whom calls to it should be modified.
    std::unordered_set<Name> callTargetsToLocalize;

    // As we optimize, we mark things as stale.
    auto markStale = [&](Name func) {
      // We only ever mark functions stale (not the global scope, which we never
      // modify). An attempt to modify the global scope, identified by a null
      // function name, is a logic bug.
      assert(func.is());
      infoMap[func].markStale();
    };
    auto markCallersStale = [&](const std::vector<Call*>& calls) {
      for (auto* call : calls) {
        markStale(expressionFuncs[call]);
      }
    };

    // We now have a mapping of all call sites for each function, and can look
    // for optimization opportunities.
    for (auto& [name, calls] : allCalls) {
      // We can only optimize if we see all the calls and can modify them.
      if (hasUnseenCalls.count(name)) {
        continue;
      }
      auto* func = module->getFunction(name);
      // Refine argument types before doing anything else. This does not
      // affect whether an argument is used or not, it just refines the type
      // where possible.
      if (refineArgumentTypes(func, calls, module, infoMap[name])) {
        worthOptimizing.insert(func);
        markStale(func->name);
      }
      // Refine return types as well.
      if (refineReturnTypes(func, calls, module)) {
        refinedReturnTypes = true;
        markStale(func->name);
        markCallersStale(calls);
      }
      auto optimizedIndexes =
        ParamUtils::applyConstantValues({func}, calls, {}, module);
      for (auto i : optimizedIndexes) {
        // Mark it as unused, which we know it now is (no point to re-scan just
        // for that).
        infoMap[name].unusedParams.insert(i);
      }
      if (!optimizedIndexes.empty()) {
        markStale(func->name);
      }
    }
    if (refinedReturnTypes) {
      // Changing a call expression's return type can propagate out to its
      // parents, and so we must refinalize.
      // TODO: We could track in which functions we actually make changes.
      ReFinalize().run(getPassRunner(), module);
    }
    // We now know which parameters are unused, and can potentially remove them.
    for (auto& [name, calls] : allCalls) {
      if (hasUnseenCalls.count(name)) {
        continue;
      }
      auto* func = module->getFunction(name);
      auto numParams = func->getNumParams();
      if (numParams == 0) {
        continue;
      }
      auto [removedIndexes, outcome] = ParamUtils::removeParameters(
        {func}, infoMap[name].unusedParams, calls, {}, module, getPassRunner());
      if (!removedIndexes.empty()) {
        // Success!
        worthOptimizing.insert(func);
        markStale(func->name);
        markCallersStale(calls);
      }
      if (outcome == ParamUtils::RemovalOutcome::Failure) {
        callTargetsToLocalize.insert(name);
      }
    }
    // We can also tell which calls have all their return values dropped. Note
    // that we can't do this if we changed anything so far, as we may have
    // modified allCalls (we can't modify a call site twice in one iteration,
    // once to remove a param, once to drop the return value).
    if (worthOptimizing.empty()) {
      for (auto& func : module->functions) {
        if (func->getResults() == Type::none) {
          continue;
        }
        auto name = func->name;
        if (hasUnseenCalls.count(name)) {
          continue;
        }
        if (infoMap[name].hasTailCalls) {
          continue;
        }
        if (tailCallees.count(name)) {
          continue;
        }
        auto iter = allCalls.find(name);
        if (iter == allCalls.end()) {
          continue;
        }
        auto& calls = iter->second;
        bool allDropped =
          std::all_of(calls.begin(), calls.end(), [&](Call* call) {
            return allDroppedCalls.count(call);
          });
        if (!allDropped) {
          continue;
        }
        if (removeReturnValue(func.get(), calls, module)) {
          // We should optimize the callers.
          for (auto* call : calls) {
            worthOptimizing.insert(module->getFunction(expressionFuncs[call]));
          }
        }
        // TODO Removing a drop may also open optimization opportunities in the
        // callers.
        worthOptimizing.insert(func.get());
        markStale(func->name);
        markCallersStale(calls);
      }
    }
    if (!callTargetsToLocalize.empty()) {
      ParamUtils::localizeCallsTo(
        callTargetsToLocalize, *module, getPassRunner(), [&](Function* func) {
          markStale(func->name);
        });
    }
    if (optimize && !worthOptimizing.empty()) {
      OptUtils::optimizeAfterInlining(worthOptimizing, module, getPassRunner());
    }

    return !worthOptimizing.empty() || refinedReturnTypes ||
           !callTargetsToLocalize.empty();
  }